

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_zip_internal_state *pmVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) &&
       (pmVar1 = pZip->m_pState, uVar4 = uVar3, pmVar1 != (mz_zip_internal_state *)0x0)) &&
      (file_index < pZip->m_total_files)) &&
     ((pZip->m_zip_mode == MZ_ZIP_MODE_READING &&
      (pvVar2 = (pmVar1->m_central_dir).m_p, pvVar2 != (void *)0x0)))) {
    uVar4 = *(byte *)((long)pvVar2 +
                     (ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p +
                                     (ulong)file_index * 4) + 8) & 1;
  }
  return uVar4;
}

Assistant:

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,
                                        mz_uint file_index) {
  mz_uint m_bit_flag;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p)
    return MZ_FALSE;
  m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  return (m_bit_flag & 1);
}